

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O0

uint64_t __thiscall r_exec::HLPController::get_requirement_count(HLPController *this)

{
  mutex_type *pmVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  uint64_t r_c;
  HLPController *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            (&local_20,&(this->super_OController).super_Controller.m_reductionMutex);
  pmVar1 = (mutex_type *)this->requirement_count;
  guard._M_device = pmVar1;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return (uint64_t)pmVar1;
}

Assistant:

uint64_t HLPController::get_requirement_count()
{
    uint64_t r_c;
    std::lock_guard<std::mutex> guard(m_reductionMutex);
    r_c = requirement_count;
    return r_c;
}